

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

string * argagg::fmt_string(string *__return_storage_ptr__,string *s)

{
  istream *piVar1;
  string line;
  string local_1d8;
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)s,_S_out|_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ss,(string *)&line,'\n');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    wrap_line(&local_1d8,&line,0x4b);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

inline
std::string fmt_string(const std::string& s)
{
  std::stringstream ss(s);
  std::string line;

  std::string result;

  // Use default width of `fmt`.
  const auto column_width = 75;

  while (std::getline(ss, line, '\n')) {
    result += wrap_line(line, column_width);
  }

  return result;
}